

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int parse_zlib_header(zbuf *a)

{
  uint uVar1;
  uint uVar2;
  int flg;
  int cm;
  int cmf;
  zbuf *a_local;
  
  uVar1 = zget8(a);
  uVar2 = zget8(a);
  if ((int)(uVar1 * 0x100 + uVar2) % 0x1f == 0) {
    if ((uVar2 & 0x20) == 0) {
      if ((uVar1 & 0xf) == 8) {
        a_local._4_4_ = 1;
      }
      else {
        a_local._4_4_ = e("Corrupt PNG");
      }
    }
    else {
      a_local._4_4_ = e("Corrupt PNG");
    }
  }
  else {
    a_local._4_4_ = e("Corrupt PNG");
  }
  return a_local._4_4_;
}

Assistant:

static int parse_zlib_header(zbuf *a)
{
   int cmf   = zget8(a);
   int cm    = cmf & 15;
   /* int cinfo = cmf >> 4; */
   int flg   = zget8(a);
   if ((cmf*256+flg) % 31 != 0) return e("bad zlib header","Corrupt PNG"); // zlib spec
   if (flg & 32) return e("no preset dict","Corrupt PNG"); // preset dictionary not allowed in png
   if (cm != 8) return e("bad compression","Corrupt PNG"); // DEFLATE required for png
   // window = 1 << (8 + cinfo)... but who cares, we fully buffer output
   return 1;
}